

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-fds.c
# Opt level: O2

void delete_from_fd(lws_context *context,int fd)

{
  int iVar1;
  lws **pplVar2;
  lws **pplVar3;
  long lVar4;
  ulong uVar5;
  
  pplVar2 = context->lws_lookup;
  if ((context->field_0x511 & 4) == 0) {
    pplVar2[fd] = (lws *)0x0;
  }
  else {
    iVar1 = context->max_fds;
    for (lVar4 = 0; (long)iVar1 * 8 != lVar4; lVar4 = lVar4 + 8) {
      if ((*(long *)((long)pplVar2 + lVar4) != 0) &&
         (*(int *)(*(long *)((long)pplVar2 + lVar4) + 0x2c0) == fd)) {
        *(undefined8 *)((long)pplVar2 + lVar4) = 0;
        goto LAB_00133d5b;
      }
    }
    _lws_log(1,"%s: fd %d not found\n","delete_from_fd",fd);
LAB_00133d5b:
    uVar5 = 0;
    for (pplVar3 = context->lws_lookup; pplVar3 != pplVar2 + iVar1; pplVar3 = pplVar3 + 1) {
      if ((*pplVar3 != (lws *)0x0) && (((*pplVar3)->desc).sockfd == fd)) {
        _lws_log(1,"%s: fd %d in lws_lookup again at %d\n","delete_from_fd",fd,uVar5);
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/plat/unix/unix-fds.c"
                      ,0x91,"void delete_from_fd(const struct lws_context *, int)");
      }
      uVar5 = (ulong)((int)uVar5 + 1);
    }
  }
  return;
}

Assistant:

void
delete_from_fd(const struct lws_context *context, int fd)
{

	struct lws **p, **done;

	if (!context->max_fds_unrelated_to_ulimit) {
		context->lws_lookup[fd - lws_plat_socket_offset()] = NULL;

		return;
	}

	/* slow fds handling */

	p = context->lws_lookup;
	done = &p[context->max_fds];

	/* find the match */

	while (p != done && (!*p || (*p)->desc.sockfd != fd))
		p++;

	if (p == done)
		lwsl_err("%s: fd %d not found\n", __func__, fd);
	else
		*p = NULL;

#if defined(_DEBUG)
	p = context->lws_lookup;
	while (p != done && (!*p || (*p)->desc.sockfd != fd))
		p++;

	if (p != done) {
		lwsl_err("%s: fd %d in lws_lookup again at %d\n", __func__,
				fd, (int)(p - context->lws_lookup));
		assert(0);
	}
#endif
}